

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollDirection direction,bool page,bool active)

{
  quint8 *pqVar1;
  QWidget *this_00;
  QWidget *pQVar2;
  QRect *pQVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QStyle *pQVar9;
  long lVar10;
  int iVar11;
  Representation *pRVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->scroll != (QMenuScroller *)0x0) &&
     ((this->scroll->scrollFlags & direction) != ScrollNone)) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    iVar6 = 0;
    local_48 = popupGeometry(this,(QScreen *)0x0);
    updateActionRects(this,&local_48);
    iVar5 = 0;
    if ((this->scroll->scrollFlags & 1) != 0) {
      pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar9 = QWidget::style(pQVar2);
      iVar5 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1b,0,pQVar2);
    }
    if ((this->scroll->scrollFlags & 2) != 0) {
      pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar9 = QWidget::style(pQVar2);
      iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1b,0,pQVar2);
    }
    pQVar9 = QWidget::style(this_00);
    iVar7 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1d,0,this_00);
    pQVar9 = QWidget::style(this_00);
    iVar8 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1e,0,this_00);
    iVar7 = iVar5 - iVar7;
    if (iVar5 == 0) {
      iVar7 = 0;
    }
    if (direction == ScrollUp) {
      lVar10 = (this->super_QWidgetPrivate).actions.d.size;
      if (lVar10 != 0) {
        pQVar3 = (this->actionRects).d.ptr;
        lVar13 = 0;
        iVar5 = 0;
        do {
          iVar5 = iVar5 + ~*(uint *)((long)&(pQVar3->y2).m_i + lVar13 * 2) +
                  *(int *)((long)&(pQVar3->y1).m_i + lVar13 * 2);
          if (iVar5 <= this->scroll->scrollOffset - iVar7) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              scrollMenu(this,*(QAction **)
                               ((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar13),
                         ScrollTop - page,active);
              return;
            }
            goto LAB_00460c34;
          }
          lVar13 = lVar13 + 8;
        } while (lVar10 << 3 != lVar13);
      }
    }
    else if (direction == ScrollDown) {
      lVar10 = (this->super_QWidgetPrivate).actions.d.size;
      if (lVar10 != 0) {
        lVar13 = 0;
        iVar14 = 0;
        iVar15 = 0;
        bVar4 = false;
        do {
          pQVar3 = (this->actionRects).d.ptr;
          iVar14 = iVar14 + ~pQVar3[lVar13].y2.m_i + pQVar3[lVar13].y1.m_i;
          iVar11 = this->scroll->scrollOffset;
          iVar16 = iVar11 - iVar7;
          if (iVar14 <= iVar16) {
            iVar11 = (iVar11 - iVar14) - iVar7;
            lVar13 = (long)iVar15;
            pRVar12 = &pQVar3[lVar13 + 1].y2;
            do {
              lVar13 = lVar13 + 1;
              if (lVar10 <= lVar13) {
                iVar15 = iVar15 + 1;
                goto LAB_00460b38;
              }
              iVar11 = ((iVar11 + pRVar12->m_i) - pRVar12[-2].m_i) + 1;
              iVar15 = iVar15 + 1;
              pRVar12 = pRVar12 + 4;
            } while (iVar11 <= ((this_00->data->crect).y2.m_i + (1 - (iVar5 + iVar6 + iVar8 * 2))) -
                               (this_00->data->crect).y1.m_i);
            scrollMenu(this,(this->super_QWidgetPrivate).actions.d.ptr[lVar13],page + ScrollBottom,
                       active);
            bVar4 = true;
          }
LAB_00460b38:
          if (iVar14 <= iVar16) break;
          iVar15 = iVar15 + 1;
          lVar13 = (long)iVar15;
          lVar10 = (this->super_QWidgetPrivate).actions.d.size;
        } while (lVar13 < lVar10);
        if (bVar4) goto LAB_00460bd4;
      }
      pqVar1 = &this->scroll->scrollFlags;
      *pqVar1 = *pqVar1 & 0xfd;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidget::update(this_00);
        return;
      }
      goto LAB_00460c34;
    }
  }
LAB_00460bd4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00460c34:
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollDirection direction, bool page, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !(scroll->scrollFlags & direction)) //not really possible...
        return;
    updateActionRects();
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);
    const int offset = topScroll ? topScroll-vmargin : 0;
    if (direction == QMenuScroller::ScrollUp) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum -= actionRects.at(i).height();
            if (saccum <= scroll->scrollOffset-offset) {
                scrollMenu(actions.at(i), page ? QMenuScroller::ScrollBottom : QMenuScroller::ScrollTop, active);
                break;
            }
        }
    } else if (direction == QMenuScroller::ScrollDown) {
        bool scrolled = false;
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            const int iHeight = actionRects.at(i).height();
            saccum -= iHeight;
            if (saccum <= scroll->scrollOffset-offset) {
                const int scrollerArea = q->height() - botScroll - fw*2;
                int visible = (scroll->scrollOffset-offset) - saccum;
                for(i++ ; i < actions.size(); i++) {
                    visible += actionRects.at(i).height();
                    if (visible > scrollerArea - topScroll) {
                        scrolled = true;
                        scrollMenu(actions.at(i), page ? QMenuScroller::ScrollTop : QMenuScroller::ScrollBottom, active);
                        break;
                    }
                }
                break;
            }
        }
        if (!scrolled) {
            scroll->scrollFlags &= ~QMenuScroller::ScrollDown;
            q->update();
        }
    }
}